

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

void Simple::get_http_10_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> local_218;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  get_http_10 local_29 [8];
  get_http_10 t;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_78 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"get_http_10");
  std::operator<<((ostream *)&local_218,"\" fixture ctor");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_80,0x38);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_68 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"get_http_10");
  std::operator<<((ostream *)&local_218,"\" fixture setup");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_70,0x38);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_58 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"get_http_10");
  std::operator<<((ostream *)&local_218,"\" test entry");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0x38);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  get_http_10::test_method(local_29);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_48 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"get_http_10");
  std::operator<<((ostream *)&local_218,"\" fixture teardown");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_50,0x38);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/request.cpp";
  local_38 = "";
  memset(&local_218,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_218);
  std::operator<<((ostream *)&local_218,'\"');
  std::operator<<((ostream *)&local_218,"get_http_10");
  std::operator<<((ostream *)&local_218,"\" fixture dtor");
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_218);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_40,0x38);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_218);
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(get_http_10, RequestFixture)
{
    const char *text = "GET /uri HTTP/1.0\r\n\r\n";
    Request result = parse(text);
    Request should = RequestDsl()
            .method("GET")
            .uri("/uri")
            .version(1, 0)
            .keepAlive(false);
    
    BOOST_CHECK_EQUAL(result.inspect(), should.inspect());
}